

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

char * http_status_str(http_status s)

{
  char *pcStack_10;
  http_status s_local;
  
  switch(s) {
  case HTTP_STATUS_CONTINUE:
    pcStack_10 = "Continue";
    break;
  case HTTP_STATUS_SWITCHING_PROTOCOLS:
    pcStack_10 = "Switching Protocols";
    break;
  case HTTP_STATUS_PROCESSING:
    pcStack_10 = "Processing";
    break;
  default:
    pcStack_10 = "<unknown>";
    break;
  case HTTP_STATUS_OK:
    pcStack_10 = "OK";
    break;
  case HTTP_STATUS_CREATED:
    pcStack_10 = "Created";
    break;
  case HTTP_STATUS_ACCEPTED:
    pcStack_10 = "Accepted";
    break;
  case HTTP_STATUS_NON_AUTHORITATIVE_INFORMATION:
    pcStack_10 = "Non-Authoritative Information";
    break;
  case HTTP_STATUS_NO_CONTENT:
    pcStack_10 = "No Content";
    break;
  case HTTP_STATUS_RESET_CONTENT:
    pcStack_10 = "Reset Content";
    break;
  case HTTP_STATUS_PARTIAL_CONTENT:
    pcStack_10 = "Partial Content";
    break;
  case HTTP_STATUS_MULTI_STATUS:
    pcStack_10 = "Multi-Status";
    break;
  case HTTP_STATUS_ALREADY_REPORTED:
    pcStack_10 = "Already Reported";
    break;
  case HTTP_STATUS_IM_USED:
    pcStack_10 = "IM Used";
    break;
  case HTTP_STATUS_MULTIPLE_CHOICES:
    pcStack_10 = "Multiple Choices";
    break;
  case HTTP_STATUS_MOVED_PERMANENTLY:
    pcStack_10 = "Moved Permanently";
    break;
  case HTTP_STATUS_FOUND:
    pcStack_10 = "Found";
    break;
  case HTTP_STATUS_SEE_OTHER:
    pcStack_10 = "See Other";
    break;
  case HTTP_STATUS_NOT_MODIFIED:
    pcStack_10 = "Not Modified";
    break;
  case HTTP_STATUS_USE_PROXY:
    pcStack_10 = "Use Proxy";
    break;
  case HTTP_STATUS_TEMPORARY_REDIRECT:
    pcStack_10 = "Temporary Redirect";
    break;
  case HTTP_STATUS_PERMANENT_REDIRECT:
    pcStack_10 = "Permanent Redirect";
    break;
  case HTTP_STATUS_BAD_REQUEST:
    pcStack_10 = "Bad Request";
    break;
  case HTTP_STATUS_UNAUTHORIZED:
    pcStack_10 = "Unauthorized";
    break;
  case HTTP_STATUS_PAYMENT_REQUIRED:
    pcStack_10 = "Payment Required";
    break;
  case HTTP_STATUS_FORBIDDEN:
    pcStack_10 = "Forbidden";
    break;
  case HTTP_STATUS_NOT_FOUND:
    pcStack_10 = "Not Found";
    break;
  case HTTP_STATUS_METHOD_NOT_ALLOWED:
    pcStack_10 = "Method Not Allowed";
    break;
  case HTTP_STATUS_NOT_ACCEPTABLE:
    pcStack_10 = "Not Acceptable";
    break;
  case HTTP_STATUS_PROXY_AUTHENTICATION_REQUIRED:
    pcStack_10 = "Proxy Authentication Required";
    break;
  case HTTP_STATUS_REQUEST_TIMEOUT:
    pcStack_10 = "Request Timeout";
    break;
  case HTTP_STATUS_CONFLICT:
    pcStack_10 = "Conflict";
    break;
  case HTTP_STATUS_GONE:
    pcStack_10 = "Gone";
    break;
  case HTTP_STATUS_LENGTH_REQUIRED:
    pcStack_10 = "Length Required";
    break;
  case HTTP_STATUS_PRECONDITION_FAILED:
    pcStack_10 = "Precondition Failed";
    break;
  case HTTP_STATUS_PAYLOAD_TOO_LARGE:
    pcStack_10 = "Payload Too Large";
    break;
  case HTTP_STATUS_URI_TOO_LONG:
    pcStack_10 = "URI Too Long";
    break;
  case HTTP_STATUS_UNSUPPORTED_MEDIA_TYPE:
    pcStack_10 = "Unsupported Media Type";
    break;
  case HTTP_STATUS_RANGE_NOT_SATISFIABLE:
    pcStack_10 = "Range Not Satisfiable";
    break;
  case HTTP_STATUS_EXPECTATION_FAILED:
    pcStack_10 = "Expectation Failed";
    break;
  case HTTP_STATUS_MISDIRECTED_REQUEST:
    pcStack_10 = "Misdirected Request";
    break;
  case HTTP_STATUS_UNPROCESSABLE_ENTITY:
    pcStack_10 = "Unprocessable Entity";
    break;
  case HTTP_STATUS_LOCKED:
    pcStack_10 = "Locked";
    break;
  case HTTP_STATUS_FAILED_DEPENDENCY:
    pcStack_10 = "Failed Dependency";
    break;
  case HTTP_STATUS_UPGRADE_REQUIRED:
    pcStack_10 = "Upgrade Required";
    break;
  case HTTP_STATUS_PRECONDITION_REQUIRED:
    pcStack_10 = "Precondition Required";
    break;
  case HTTP_STATUS_TOO_MANY_REQUESTS:
    pcStack_10 = "Too Many Requests";
    break;
  case HTTP_STATUS_REQUEST_HEADER_FIELDS_TOO_LARGE:
    pcStack_10 = "Request Header Fields Too Large";
    break;
  case HTTP_STATUS_UNAVAILABLE_FOR_LEGAL_REASONS:
    pcStack_10 = "Unavailable For Legal Reasons";
    break;
  case HTTP_STATUS_INTERNAL_SERVER_ERROR:
    pcStack_10 = "Internal Server Error";
    break;
  case HTTP_STATUS_NOT_IMPLEMENTED:
    pcStack_10 = "Not Implemented";
    break;
  case HTTP_STATUS_BAD_GATEWAY:
    pcStack_10 = "Bad Gateway";
    break;
  case HTTP_STATUS_SERVICE_UNAVAILABLE:
    pcStack_10 = "Service Unavailable";
    break;
  case HTTP_STATUS_GATEWAY_TIMEOUT:
    pcStack_10 = "Gateway Timeout";
    break;
  case HTTP_STATUS_HTTP_VERSION_NOT_SUPPORTED:
    pcStack_10 = "HTTP Version Not Supported";
    break;
  case HTTP_STATUS_VARIANT_ALSO_NEGOTIATES:
    pcStack_10 = "Variant Also Negotiates";
    break;
  case HTTP_STATUS_INSUFFICIENT_STORAGE:
    pcStack_10 = "Insufficient Storage";
    break;
  case HTTP_STATUS_LOOP_DETECTED:
    pcStack_10 = "Loop Detected";
    break;
  case HTTP_STATUS_NOT_EXTENDED:
    pcStack_10 = "Not Extended";
    break;
  case HTTP_STATUS_NETWORK_AUTHENTICATION_REQUIRED:
    pcStack_10 = "Network Authentication Required";
  }
  return pcStack_10;
}

Assistant:

const char *
http_status_str (enum http_status s)
{
  switch (s) {
#define XX(num, name, string) case HTTP_STATUS_##name: return #string;
    HTTP_STATUS_MAP(XX)
#undef XX
    default: return "<unknown>";
  }
}